

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O2

void RegisterMiningRPCCommands(CRPCTable *t)

{
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffe68;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterMiningRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterMiningRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_40,"mining",(allocator<char> *)&stack0xfffffffffffffe7f);
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_40);
      std::__cxx11::string::string<std::allocator<char>>
                (local_60,"mining",(allocator<char> *)&stack0xfffffffffffffe7e);
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 1,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_60);
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"mining",(allocator<char> *)&stack0xfffffffffffffe7d);
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 2,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_80);
      std::__cxx11::string::string<std::allocator<char>>
                (local_a0,"mining",(allocator<char> *)&stack0xfffffffffffffe7c);
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 3,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,"mining",(allocator<char> *)&stack0xfffffffffffffe7b);
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 4,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_e0,"mining",(allocator<char> *)&stack0xfffffffffffffe7a);
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 5,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_100,"mining",(allocator<char> *)&stack0xfffffffffffffe79);
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 6,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_100);
      std::__cxx11::string::string<std::allocator<char>>
                (local_120,"hidden",(allocator<char> *)&stack0xfffffffffffffe78);
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 7,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_120);
      std::__cxx11::string::string<std::allocator<char>>
                (local_140,"hidden",(allocator<char> *)&stack0xfffffffffffffe77);
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 8,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_140);
      std::__cxx11::string::string<std::allocator<char>>
                (local_160,"hidden",(allocator<char> *)&stack0xfffffffffffffe76);
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 9,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)local_160);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffe80,"hidden",
                 (allocator<char> *)&stack0xfffffffffffffe75);
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 10,in_stack_fffffffffffffe68,
                 (RpcMethodFnType)&stack0xfffffffffffffe80);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterMiningRPCCommands(CRPCTable&)::commands);
    }
  }
  pcmd = RegisterMiningRPCCommands::commands;
  for (lVar2 = 0x580; lVar2 != 0; lVar2 = lVar2 + -0x80) {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterMiningRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"mining", &getnetworkhashps},
        {"mining", &getmininginfo},
        {"mining", &prioritisetransaction},
        {"mining", &getprioritisedtransactions},
        {"mining", &getblocktemplate},
        {"mining", &submitblock},
        {"mining", &submitheader},

        {"hidden", &generatetoaddress},
        {"hidden", &generatetodescriptor},
        {"hidden", &generateblock},
        {"hidden", &generate},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}